

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::PlotStemsEx<ImPlot::GetterXsYs<double>,ImPlot::GetterXsYRef<double>>
               (char *label_id,GetterXsYs<double> *get_mark,GetterXsYRef<double> *get_base)

{
  ImPlotRange *pIVar1;
  double dVar2;
  double dVar3;
  ImVec2 IVar4;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  TransformerLogLog transformer;
  ImPlotPlot *pIVar14;
  double dVar15;
  double dVar16;
  ImPlotContext *pIVar17;
  bool bVar18;
  byte bVar19;
  ImU32 IVar20;
  ImU32 col_mk_fill;
  long lVar21;
  ImDrawList *DrawList;
  long lVar22;
  ImPlotContext *pIVar23;
  byte bVar24;
  double *pdVar25;
  double *pdVar26;
  GetterXsYs<double> *pGVar27;
  int iVar28;
  int iVar29;
  ulong uVar30;
  ulong uVar31;
  float fVar32;
  double dVar33;
  float fVar34;
  undefined8 local_88;
  GetterXsYs<double> *local_80;
  ulong local_78;
  double local_70;
  ulong local_68;
  double *local_60;
  double *local_58;
  uint local_50;
  uint local_4c;
  double *local_48;
  undefined8 uStack_40;
  
  bVar18 = BeginItem(label_id,0);
  pIVar23 = GImPlot;
  if (bVar18) {
    if ((GImPlot->FitThisFrame == true) && (iVar7 = get_base->Count, 0 < iVar7)) {
      local_48 = get_mark->Xs;
      local_58 = get_mark->Ys;
      iVar29 = get_mark->Count;
      uVar8 = get_mark->Offset;
      local_60 = (double *)(ulong)uVar8;
      local_68 = (ulong)get_mark->Stride;
      pIVar14 = GImPlot->CurrentPlot;
      iVar9 = pIVar14->CurrentYAxis;
      uVar10 = (pIVar14->XAxis).Flags;
      uVar11 = pIVar14->YAxis[iVar9].Flags;
      dVar2 = get_base->YRef;
      local_70 = ABS(dVar2);
      pIVar1 = GImPlot->ExtentsY + iVar9;
      bVar19 = dVar2 <= 0.0 & (byte)uVar11 >> 5;
      bVar24 = 0x7fefffffffffffff < (ulong)local_70 | bVar19;
      local_78 = CONCAT71(local_78._1_7_,bVar24);
      pdVar25 = get_base->Xs;
      iVar12 = get_base->Offset;
      iVar13 = get_base->Stride;
      iVar28 = 0;
      do {
        lVar21 = (long)(((int)(uVar8 + iVar28) % iVar29 + iVar29) % iVar29) * local_68;
        dVar33 = *(double *)((long)local_48 + lVar21);
        dVar3 = *(double *)((long)local_58 + lVar21);
        if ((uVar10 >> 10 & 1) == 0) {
          if ((ulong)ABS(dVar33) < 0x7ff0000000000000) {
LAB_002108e4:
            if ((0.0 < dVar33) || ((uVar10 & 0x20) == 0)) {
              dVar15 = (pIVar23->ExtentsX).Min;
              dVar16 = (pIVar23->ExtentsX).Max;
              uVar30 = -(ulong)(dVar33 < dVar15);
              uVar31 = -(ulong)(dVar16 < dVar33);
              (pIVar23->ExtentsX).Min = (double)(~uVar30 & (ulong)dVar15 | (ulong)dVar33 & uVar30);
              (pIVar23->ExtentsX).Max = (double)(~uVar31 & (ulong)dVar16 | (ulong)dVar33 & uVar31);
            }
          }
        }
        else if ((((ulong)ABS(dVar33) < 0x7ff0000000000000) &&
                 (pIVar14->YAxis[iVar9].Range.Min <= dVar3)) &&
                (dVar3 <= pIVar14->YAxis[iVar9].Range.Max)) goto LAB_002108e4;
        if ((uVar11 >> 10 & 1) == 0) {
          if ((ulong)ABS(dVar3) < 0x7ff0000000000000) {
LAB_0021095f:
            if ((0.0 < dVar3) || ((uVar11 & 0x20) == 0)) {
              uVar30 = -(ulong)(dVar3 < pIVar1->Min);
              uVar31 = -(ulong)(pIVar1->Max < dVar3);
              pIVar1->Min = (double)(~uVar30 & (ulong)pIVar1->Min | (ulong)dVar3 & uVar30);
              pIVar1->Max = (double)(~uVar31 & (ulong)pIVar1->Max | (ulong)dVar3 & uVar31);
            }
          }
        }
        else if ((((ulong)ABS(dVar3) < 0x7ff0000000000000) && ((pIVar14->XAxis).Range.Min <= dVar33)
                 ) && (dVar33 <= (pIVar14->XAxis).Range.Max)) goto LAB_0021095f;
        dVar33 = *(double *)
                  ((long)pdVar25 +
                  (long)(((iVar12 + iVar28) % iVar7 + iVar7) % iVar7) * (long)iVar13);
        if ((uVar10 >> 10 & 1) == 0) {
          if ((ulong)ABS(dVar33) < 0x7ff0000000000000) {
LAB_002109ec:
            if (((uVar10 & 0x20) == 0) || (0.0 < dVar33)) {
              dVar3 = (pIVar23->ExtentsX).Min;
              dVar15 = (pIVar23->ExtentsX).Max;
              uVar30 = -(ulong)(dVar33 < dVar3);
              uVar31 = -(ulong)(dVar15 < dVar33);
              (pIVar23->ExtentsX).Min = (double)(~uVar30 & (ulong)dVar3 | (ulong)dVar33 & uVar30);
              (pIVar23->ExtentsX).Max = (double)(~uVar31 & (ulong)dVar15 | (ulong)dVar33 & uVar31);
            }
          }
        }
        else if ((((ulong)ABS(dVar33) < 0x7ff0000000000000) &&
                 (pIVar14->YAxis[iVar9].Range.Min <= dVar2)) &&
                (dVar2 <= pIVar14->YAxis[iVar9].Range.Max)) goto LAB_002109ec;
        if ((uVar11 >> 10 & 1) == 0) {
          if (bVar24 == 0) {
LAB_00210a3e:
            uVar30 = -(ulong)(dVar2 < pIVar1->Min);
            uVar31 = -(ulong)(pIVar1->Max < dVar2);
            pIVar1->Min = (double)(~uVar30 & (ulong)pIVar1->Min | (ulong)dVar2 & uVar30);
            pIVar1->Max = (double)(~uVar31 & (ulong)pIVar1->Max | (ulong)dVar2 & uVar31);
          }
        }
        else if (((ulong)local_70 < 0x7ff0000000000000 && bVar19 == 0) &&
                 (dVar33 <= (pIVar14->XAxis).Range.Max && (pIVar14->XAxis).Range.Min <= dVar33))
        goto LAB_00210a3e;
        iVar28 = iVar28 + 1;
      } while (iVar7 != iVar28);
    }
    local_80 = get_mark;
    DrawList = GetPlotDrawList();
    pGVar27 = local_80;
    if ((pIVar23->NextItemData).RenderLine == true) {
      IVar20 = ImGui::GetColorU32((pIVar23->NextItemData).Colors);
      iVar7 = GImPlot->CurrentPlot->CurrentYAxis;
      switch(GImPlot->Scales[iVar7]) {
      case 0:
        local_88 = CONCAT44(local_88._4_4_,iVar7);
        RenderLineSegments<ImPlot::GetterXsYs<double>,ImPlot::GetterXsYRef<double>,ImPlot::TransformerLinLin>
                  (pGVar27,get_base,(TransformerLinLin *)&local_88,DrawList,
                   (pIVar23->NextItemData).LineWeight,IVar20);
        break;
      case 1:
        local_88 = CONCAT44(local_88._4_4_,iVar7);
        RenderLineSegments<ImPlot::GetterXsYs<double>,ImPlot::GetterXsYRef<double>,ImPlot::TransformerLogLin>
                  (pGVar27,get_base,(TransformerLogLin *)&local_88,DrawList,
                   (pIVar23->NextItemData).LineWeight,IVar20);
        break;
      case 2:
        local_88 = CONCAT44(local_88._4_4_,iVar7);
        RenderLineSegments<ImPlot::GetterXsYs<double>,ImPlot::GetterXsYRef<double>,ImPlot::TransformerLinLog>
                  (pGVar27,get_base,(TransformerLinLog *)&local_88,DrawList,
                   (pIVar23->NextItemData).LineWeight,IVar20);
        break;
      case 3:
        local_88 = CONCAT44(local_88._4_4_,iVar7);
        RenderLineSegments<ImPlot::GetterXsYs<double>,ImPlot::GetterXsYRef<double>,ImPlot::TransformerLogLog>
                  (pGVar27,get_base,(TransformerLogLog *)&local_88,DrawList,
                   (pIVar23->NextItemData).LineWeight,IVar20);
      }
    }
    iVar7 = (pIVar23->NextItemData).Marker;
    iVar29 = 0;
    if (iVar7 != -1) {
      iVar29 = iVar7;
    }
    PopPlotClipRect();
    PushPlotClipRect((pIVar23->NextItemData).MarkerSize);
    IVar20 = ImGui::GetColorU32((pIVar23->NextItemData).Colors + 2);
    col_mk_fill = ImGui::GetColorU32((pIVar23->NextItemData).Colors + 3);
    pIVar17 = GImPlot;
    transformer.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
    lVar21 = (long)transformer.YAxis;
    switch(GImPlot->Scales[lVar21]) {
    case 0:
      iVar7 = pGVar27->Count;
      if (0 < iVar7) {
        pdVar25 = pGVar27->Xs;
        pdVar26 = pGVar27->Ys;
        uVar30 = (ulong)(uint)pGVar27->Offset;
        local_60 = (double *)CONCAT44(local_60._4_4_,(pIVar23->NextItemData).MarkerSize);
        local_68 = CONCAT44(local_68._4_4_,(pIVar23->NextItemData).MarkerWeight);
        pGVar27 = (GetterXsYs<double> *)(long)pGVar27->Stride;
        local_70 = (double)(long)iVar29;
        iVar29 = 0;
        bVar18 = (pIVar23->NextItemData).RenderMarkerLine;
        bVar6 = (pIVar23->NextItemData).RenderMarkerFill;
        pIVar23 = GImPlot;
        local_80 = pGVar27;
        local_78 = uVar30;
        local_58 = pdVar25;
        local_48 = pdVar26;
        do {
          lVar22 = (long)((((int)uVar30 + iVar29) % iVar7 + iVar7) % iVar7) * (long)pGVar27;
          IVar4 = pIVar23->PixelRange[lVar21].Min;
          fVar32 = (float)(pIVar23->Mx *
                           (*(double *)((long)pdVar25 + lVar22) -
                           (pIVar23->CurrentPlot->XAxis).Range.Min) + (double)IVar4.x);
          fVar34 = (float)(pIVar23->My[lVar21] *
                           (*(double *)((long)pdVar26 + lVar22) -
                           pIVar23->CurrentPlot->YAxis[lVar21].Range.Min) + (double)IVar4.y);
          local_88 = CONCAT44(fVar34,fVar32);
          pIVar14 = pIVar17->CurrentPlot;
          if ((((pIVar14->PlotRect).Min.x <= fVar32) && ((pIVar14->PlotRect).Min.y <= fVar34)) &&
             ((fVar32 < (pIVar14->PlotRect).Max.x && (fVar34 < (pIVar14->PlotRect).Max.y)))) {
            (**(code **)(RenderMarkers<ImPlot::TransformerLinLin,ImPlot::GetterXsYs<double>>(ImPlot::GetterXsYs<double>,ImPlot::TransformerLinLin,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                         ::marker_table + (long)local_70 * 8))
                      (DrawList,&local_88,bVar18,IVar20,bVar6,col_mk_fill);
            pIVar23 = GImPlot;
            pdVar25 = local_58;
            pdVar26 = local_48;
            uVar30 = local_78;
            pGVar27 = local_80;
          }
          iVar29 = iVar29 + 1;
        } while (iVar7 != iVar29);
      }
      break;
    case 1:
      iVar7 = pGVar27->Count;
      if (0 < iVar7) {
        local_58 = pGVar27->Xs;
        local_60 = pGVar27->Ys;
        local_68 = (ulong)(uint)pGVar27->Offset;
        local_70 = (double)(long)pGVar27->Stride;
        local_80 = (GetterXsYs<double> *)(long)iVar29;
        iVar29 = 0;
        local_78 = lVar21 << 4;
        local_4c = (uint)(pIVar23->NextItemData).RenderMarkerLine;
        local_50 = (uint)(pIVar23->NextItemData).RenderMarkerFill;
        do {
          pIVar23 = GImPlot;
          lVar22 = (long)((((int)local_68 + iVar29) % iVar7 + iVar7) % iVar7) * (long)local_70;
          local_48 = *(double **)((long)local_60 + lVar22);
          uStack_40 = 0;
          dVar33 = log10(*(double *)((long)local_58 + lVar22) /
                         (GImPlot->CurrentPlot->XAxis).Range.Min);
          pIVar14 = pIVar23->CurrentPlot;
          dVar2 = (pIVar14->XAxis).Range.Min;
          uVar5 = *(undefined8 *)((long)&pIVar23->PixelRange[0].Min.x + local_78);
          fVar32 = (float)(pIVar23->Mx *
                           (((double)(float)(dVar33 / pIVar23->LogDenX) *
                             ((pIVar14->XAxis).Range.Max - dVar2) + dVar2) - dVar2) +
                          (double)(float)uVar5);
          fVar34 = (float)(pIVar23->My[lVar21] *
                           ((double)local_48 - pIVar14->YAxis[lVar21].Range.Min) +
                          (double)(float)((ulong)uVar5 >> 0x20));
          local_88 = CONCAT44(fVar34,fVar32);
          pIVar14 = pIVar17->CurrentPlot;
          if (((((pIVar14->PlotRect).Min.x <= fVar32) && ((pIVar14->PlotRect).Min.y <= fVar34)) &&
              (fVar32 < (pIVar14->PlotRect).Max.x)) && (fVar34 < (pIVar14->PlotRect).Max.y)) {
            (**(code **)(RenderMarkers<ImPlot::TransformerLogLin,ImPlot::GetterXsYs<double>>(ImPlot::GetterXsYs<double>,ImPlot::TransformerLogLin,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                         ::marker_table + (long)local_80 * 8))
                      (DrawList,&local_88,local_4c,IVar20,local_50,col_mk_fill);
          }
          iVar29 = iVar29 + 1;
        } while (iVar7 != iVar29);
      }
      break;
    case 2:
      iVar7 = pGVar27->Count;
      if (0 < iVar7) {
        local_58 = pGVar27->Xs;
        local_60 = pGVar27->Ys;
        local_68 = (ulong)(uint)pGVar27->Offset;
        local_70 = (double)(long)pGVar27->Stride;
        local_80 = (GetterXsYs<double> *)(long)iVar29;
        iVar29 = 0;
        local_78 = lVar21 << 4;
        local_4c = (uint)(pIVar23->NextItemData).RenderMarkerLine;
        local_50 = (uint)(pIVar23->NextItemData).RenderMarkerFill;
        do {
          pIVar23 = GImPlot;
          lVar22 = (long)((((int)local_68 + iVar29) % iVar7 + iVar7) % iVar7) * (long)local_70;
          local_48 = *(double **)((long)local_58 + lVar22);
          uStack_40 = 0;
          dVar33 = log10(*(double *)((long)local_60 + lVar22) /
                         GImPlot->CurrentPlot->YAxis[lVar21].Range.Min);
          pIVar14 = pIVar23->CurrentPlot;
          dVar2 = pIVar14->YAxis[lVar21].Range.Min;
          uVar5 = *(undefined8 *)((long)&pIVar23->PixelRange[0].Min.x + local_78);
          fVar32 = (float)(pIVar23->Mx * ((double)local_48 - (pIVar14->XAxis).Range.Min) +
                          (double)(float)uVar5);
          fVar34 = (float)(pIVar23->My[lVar21] *
                           (((double)(float)(dVar33 / pIVar23->LogDenY[lVar21]) *
                             (pIVar14->YAxis[lVar21].Range.Max - dVar2) + dVar2) - dVar2) +
                          (double)(float)((ulong)uVar5 >> 0x20));
          local_88 = CONCAT44(fVar34,fVar32);
          pIVar14 = pIVar17->CurrentPlot;
          if ((((pIVar14->PlotRect).Min.x <= fVar32) && ((pIVar14->PlotRect).Min.y <= fVar34)) &&
             ((fVar32 < (pIVar14->PlotRect).Max.x && (fVar34 < (pIVar14->PlotRect).Max.y)))) {
            (**(code **)(RenderMarkers<ImPlot::TransformerLinLog,ImPlot::GetterXsYs<double>>(ImPlot::GetterXsYs<double>,ImPlot::TransformerLinLog,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                         ::marker_table + (long)local_80 * 8))
                      (DrawList,&local_88,local_4c,IVar20,local_50,col_mk_fill);
          }
          iVar29 = iVar29 + 1;
        } while (iVar7 != iVar29);
      }
      break;
    case 3:
      RenderMarkers<ImPlot::TransformerLogLog,ImPlot::GetterXsYs<double>>
                (*pGVar27,transformer,DrawList,iVar29,(pIVar23->NextItemData).MarkerSize,
                 (pIVar23->NextItemData).RenderMarkerLine,IVar20,
                 (pIVar23->NextItemData).MarkerWeight,(pIVar23->NextItemData).RenderMarkerFill,
                 col_mk_fill);
    }
    pIVar23 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar23->NextItemData);
    pIVar23->PreviousItem = pIVar23->CurrentItem;
    pIVar23->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

inline void PlotStemsEx(const char* label_id, const GetterM& get_mark, const GetterB& get_base) {
    if (BeginItem(label_id, ImPlotCol_Line)) {
        if (FitThisFrame()) {
            for (int i = 0; i < get_base.Count; ++i) {
                FitPoint(get_mark(i));
                FitPoint(get_base(i));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        // render stems
        if (s.RenderLine) {
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderLineSegments(get_mark, get_base, TransformerLinLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLin: RenderLineSegments(get_mark, get_base, TransformerLogLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LinLog: RenderLineSegments(get_mark, get_base, TransformerLinLog(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLog: RenderLineSegments(get_mark, get_base, TransformerLogLog(), DrawList, s.LineWeight, col_line); break;
            }
        }
        // render markers
        ImPlotMarker marker = s.Marker == ImPlotMarker_None ? ImPlotMarker_Circle : s.Marker;
        if (marker != ImPlotMarker_None) {
            PopPlotClipRect();
            PushPlotClipRect(s.MarkerSize);
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerOutline]);
            const ImU32 col_fill = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerFill]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderMarkers(get_mark, TransformerLinLin(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLin: RenderMarkers(get_mark, TransformerLogLin(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LinLog: RenderMarkers(get_mark, TransformerLinLog(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLog: RenderMarkers(get_mark, TransformerLogLog(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
            }
        }
        EndItem();
    }
}